

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O0

string * ApprovalTests::FileUtils::getDirectory(string *filePath)

{
  long lVar1;
  string *in_RSI;
  string *in_RDI;
  size_type end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *directory;
  string local_38 [32];
  long local_18;
  string *local_10;
  
  local_10 = in_RSI;
  SystemUtils::getDirectorySeparator_abi_cxx11_();
  lVar1 = ::std::__cxx11::string::rfind(in_RSI,(ulong)local_38);
  ::std::__cxx11::string::~string(local_38);
  local_18 = lVar1 + 1;
  ::std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  return in_RDI;
}

Assistant:

std::string FileUtils::getDirectory(const std::string& filePath)
    {
        auto end = filePath.rfind(SystemUtils::getDirectorySeparator()) + 1;
        auto directory = filePath.substr(0, end);
        return directory;
    }